

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

int64_t libtorrent::aux::calc_bytes(file_storage *fs,piece_count *pc)

{
  int iVar1;
  int iVar2;
  piece_index_t index;
  int iVar3;
  int local_34;
  piece_count *pc_local;
  file_storage *fs_local;
  
  iVar1 = pc->num_pieces;
  iVar2 = file_storage::piece_length(fs);
  if ((pc->last_piece & 1U) == 0) {
    local_34 = 0;
  }
  else {
    local_34 = file_storage::piece_length(fs);
    index = file_storage::last_piece(fs);
    iVar3 = file_storage::piece_size(fs,index);
    local_34 = local_34 - iVar3;
  }
  return ((long)iVar1 * (long)iVar2 - (long)local_34) - pc->pad_bytes;
}

Assistant:

std::int64_t calc_bytes(file_storage const& fs, piece_count const& pc)
	{
		// it's an impossible combination to have 0 pieces, but still have one of them be the last piece
		TORRENT_ASSERT(!(pc.num_pieces == 0 && pc.last_piece == true));

		// if we have 0 pieces, we can't have any pad blocks either
		TORRENT_ASSERT(!(pc.num_pieces == 0 && pc.pad_bytes > 0));

		// if we have all pieces, we must also have the last one
		TORRENT_ASSERT(!(pc.num_pieces == fs.num_pieces() && pc.last_piece == false));

		// every block should not be a pad block
		TORRENT_ASSERT(pc.pad_bytes <= std::int64_t(pc.num_pieces) * fs.piece_length());

		return std::int64_t(pc.num_pieces) * fs.piece_length()
			- (pc.last_piece ? fs.piece_length() - fs.piece_size(fs.last_piece()) : 0)
			- std::int64_t(pc.pad_bytes);
	}